

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarantool_tcp.c
# Opt level: O3

int test_object(void)

{
  int iVar1;
  tnt_stream *s;
  size_t sVar2;
  ssize_t sVar3;
  char acStack_58 [8];
  char str1 [29];
  
  plan(0x66);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_object");
  fputc(10,_stdout);
  s = tnt_object((tnt_stream *)0x0);
  builtin_strncpy(str1 + 8," i can quack",0xd);
  builtin_strncpy(acStack_58,"I\'m tota",8);
  builtin_strncpy(str1,"ly duck,",8);
  sVar2 = strlen(acStack_58);
  iVar1 = __ok((uint)(s != (tnt_stream *)0x0),"Checking that object is allocated");
  if (iVar1 == 0) {
    test_object_cold_1();
  }
  iVar1 = __ok((uint)(s->alloc == 1),"Checking s->alloc");
  if (iVar1 == 0) {
    test_object_cold_2();
  }
  sVar3 = tnt_object_add_int(s,0x4bb);
  iVar1 = __ok((uint)(sVar3 == 3),"encoding int > 0");
  if (iVar1 == 0) {
    test_object_cold_3();
  }
  sVar3 = tnt_object_add_int(s,-0x4bb);
  iVar1 = __ok((uint)(sVar3 == 3),"encoding int < 0");
  if (iVar1 == 0) {
    test_object_cold_4();
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    test_object_cold_5();
  }
  sVar3 = tnt_object_add_str(s,acStack_58,(uint32_t)sVar2);
  iVar1 = __ok((uint)(sVar3 == sVar2 + 1),"encoding str");
  if (iVar1 == 0) {
    test_object_cold_6();
  }
  sVar3 = tnt_object_add_strz(s,acStack_58);
  iVar1 = __ok((uint)(sVar3 == sVar2 + 1),"encoding strz");
  if (iVar1 == 0) {
    test_object_cold_7();
  }
  iVar1 = tnt_object_type(s,TNT_SBO_SPARSE);
  iVar1 = __ok((uint)(iVar1 == -1),"Check type set (must fail)");
  if (iVar1 == 0) {
    test_object_cold_8();
  }
  iVar1 = tnt_object_reset(s);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    test_object_cold_9();
  }
  iVar1 = tnt_object_type(s,TNT_SBO_SPARSE);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    test_object_cold_10();
  }
  sVar3 = tnt_object_add_array(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"Sparse array");
  if (iVar1 == 0) {
    test_object_cold_11();
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    test_object_cold_12();
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    test_object_cold_13();
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    test_object_cold_14();
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    test_object_cold_15();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing container");
  if (iVar1 == 0) {
    test_object_cold_16();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == -1),"Erroneous container close");
  if (iVar1 == 0) {
    test_object_cold_17();
  }
  iVar1 = tnt_object_reset(s);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    test_object_cold_18();
  }
  iVar1 = tnt_object_type(s,TNT_SBO_PACKED);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    test_object_cold_19();
  }
  sVar3 = tnt_object_add_array(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"Packed array");
  if (iVar1 == 0) {
    test_object_cold_20();
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    test_object_cold_21();
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    test_object_cold_22();
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    test_object_cold_23();
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    test_object_cold_24();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing container");
  if (iVar1 == 0) {
    test_object_cold_25();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == -1),"Erroneous container close");
  if (iVar1 == 0) {
    test_object_cold_26();
  }
  iVar1 = tnt_object_reset(s);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    test_object_cold_27();
  }
  iVar1 = tnt_object_type(s,TNT_SBO_PACKED);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    test_object_cold_28();
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"Packing map-1");
  if (iVar1 == 0) {
    test_object_cold_29();
  }
  sVar3 = tnt_object_add_strz(s,"menu");
  iVar1 = __ok((uint)(sVar3 == 5),"  Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_30();
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"   Packing value (map-2)");
  if (iVar1 == 0) {
    test_object_cold_31();
  }
  sVar3 = tnt_object_add_strz(s,"popup");
  iVar1 = __ok((uint)(sVar3 == 6),"  Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_32();
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"   Packing value (map-3)");
  if (iVar1 == 0) {
    test_object_cold_33();
  }
  sVar3 = tnt_object_add_strz(s,"menuitem");
  iVar1 = __ok((uint)(sVar3 == 9),"     Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_34();
  }
  sVar3 = tnt_object_add_array(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"      Packing value (array)");
  if (iVar1 == 0) {
    test_object_cold_35();
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"        Packing value (map-4)");
  if (iVar1 == 0) {
    test_object_cold_36();
  }
  sVar3 = tnt_object_add_strz(s,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_37();
  }
  sVar3 = tnt_object_add_strz(s,"CreateNewDoc()");
  iVar1 = __ok((uint)(sVar3 == 0xf),"           Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_38();
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_39();
  }
  sVar3 = tnt_object_add_strz(s,"New");
  iVar1 = __ok((uint)(sVar3 == 4),"           Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_40();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-4");
  if (iVar1 == 0) {
    test_object_cold_41();
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"        Packing value (map-5)");
  if (iVar1 == 0) {
    test_object_cold_42();
  }
  sVar3 = tnt_object_add_strz(s,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_43();
  }
  sVar3 = tnt_object_add_strz(s,"OpenDoc()");
  iVar1 = __ok((uint)(sVar3 == 10),"           Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_44();
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_45();
  }
  sVar3 = tnt_object_add_strz(s,"Open");
  iVar1 = __ok((uint)(sVar3 == 5),"           Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_46();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-5");
  if (iVar1 == 0) {
    test_object_cold_47();
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"        Packing value (map-6)");
  if (iVar1 == 0) {
    test_object_cold_48();
  }
  sVar3 = tnt_object_add_strz(s,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_49();
  }
  sVar3 = tnt_object_add_strz(s,"CloseDoc()");
  iVar1 = __ok((uint)(sVar3 == 0xb),"           Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_50();
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_51();
  }
  sVar3 = tnt_object_add_strz(s,"Close");
  iVar1 = __ok((uint)(sVar3 == 6),"           Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_52();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-6");
  if (iVar1 == 0) {
    test_object_cold_53();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"      Closing map-3");
  if (iVar1 == 0) {
    test_object_cold_54();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"    Closing array");
  if (iVar1 == 0) {
    test_object_cold_55();
  }
  sVar3 = tnt_object_add_strz(s,"id");
  iVar1 = __ok((uint)(sVar3 == 3),"  Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_56();
  }
  sVar3 = tnt_object_add_strz(s,"file");
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_57();
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"  Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_58();
  }
  sVar3 = tnt_object_add_strz(s,"File");
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_59();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"  Closing map-2");
  if (iVar1 == 0) {
    test_object_cold_60();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing map-1");
  if (iVar1 == 0) {
    test_object_cold_61();
  }
  iVar1 = tnt_object_reset(s);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    test_object_cold_62();
  }
  iVar1 = tnt_object_type(s,TNT_SBO_SPARSE);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    test_object_cold_63();
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"Packing map-1");
  if (iVar1 == 0) {
    test_object_cold_64();
  }
  sVar3 = tnt_object_add_strz(s,"menu");
  iVar1 = __ok((uint)(sVar3 == 5),"  Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_65();
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (map-2)");
  if (iVar1 == 0) {
    test_object_cold_66();
  }
  sVar3 = tnt_object_add_strz(s,"popup");
  iVar1 = __ok((uint)(sVar3 == 6),"  Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_67();
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (map-3)");
  if (iVar1 == 0) {
    test_object_cold_68();
  }
  sVar3 = tnt_object_add_strz(s,"menuitem");
  iVar1 = __ok((uint)(sVar3 == 9),"     Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_69();
  }
  sVar3 = tnt_object_add_array(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"      Packing value (array)");
  if (iVar1 == 0) {
    test_object_cold_70();
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"        Packing value (map-4)");
  if (iVar1 == 0) {
    test_object_cold_71();
  }
  sVar3 = tnt_object_add_strz(s,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_72();
  }
  sVar3 = tnt_object_add_strz(s,"CreateNewDoc()");
  iVar1 = __ok((uint)(sVar3 == 0xf),"           Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_73();
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_74();
  }
  sVar3 = tnt_object_add_strz(s,"New");
  iVar1 = __ok((uint)(sVar3 == 4),"           Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_75();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-4");
  if (iVar1 == 0) {
    test_object_cold_76();
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"        Packing value (map-5)");
  if (iVar1 == 0) {
    test_object_cold_77();
  }
  sVar3 = tnt_object_add_strz(s,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_78();
  }
  sVar3 = tnt_object_add_strz(s,"OpenDoc()");
  iVar1 = __ok((uint)(sVar3 == 10),"           Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_79();
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_80();
  }
  sVar3 = tnt_object_add_strz(s,"Open");
  iVar1 = __ok((uint)(sVar3 == 5),"           Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_81();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-5");
  if (iVar1 == 0) {
    test_object_cold_82();
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"        Packing value (map-6)");
  if (iVar1 == 0) {
    test_object_cold_83();
  }
  sVar3 = tnt_object_add_strz(s,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_84();
  }
  sVar3 = tnt_object_add_strz(s,"CloseDoc()");
  iVar1 = __ok((uint)(sVar3 == 0xb),"           Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_85();
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_86();
  }
  sVar3 = tnt_object_add_strz(s,"Close");
  iVar1 = __ok((uint)(sVar3 == 6),"           Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_87();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-6");
  if (iVar1 == 0) {
    test_object_cold_88();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"      Closing map-3");
  if (iVar1 == 0) {
    test_object_cold_89();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"    Closing array");
  if (iVar1 == 0) {
    test_object_cold_90();
  }
  sVar3 = tnt_object_add_strz(s,"id");
  iVar1 = __ok((uint)(sVar3 == 3),"  Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_91();
  }
  sVar3 = tnt_object_add_strz(s,"file");
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_92();
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"  Packing key (str)");
  if (iVar1 == 0) {
    test_object_cold_93();
  }
  sVar3 = tnt_object_add_strz(s,"File");
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (str)");
  if (iVar1 == 0) {
    test_object_cold_94();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"  Closing map-2");
  if (iVar1 == 0) {
    test_object_cold_95();
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing map-1");
  if (iVar1 == 0) {
    test_object_cold_96();
  }
  iVar1 = tnt_object_reset(s);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    test_object_cold_97();
  }
  iVar1 = tnt_object_type(s,TNT_SBO_PACKED);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    test_object_cold_98();
  }
  sVar3 = tnt_object_add_array(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"Packing array (size more 1 byte)");
  if (iVar1 == 0) {
    test_object_cold_99();
  }
  iVar1 = 0x20;
  do {
    tnt_object_add_nil(s);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing array (size more 1 byte)");
  if (iVar1 == 0) {
    test_object_cold_100();
  }
  iVar1 = tnt_object_reset(s);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    test_object_cold_101();
  }
  sVar3 = tnt_object_format(s,"{%s{%s{%s[{%s%s%s%s}{%s%s%s%s}{%s%s%s%s}]}%s%s%s%s}}","menu","popup",
                            "menuitem","onclick","CreateNewDoc()","value","New","onclick",
                            "OpenDoc()","value","Open","onclick","CloseDoc()","value","Close","id",
                            "file","value","File");
  iVar1 = __ok((uint)(sVar3 != -1),"Pack with format");
  if (iVar1 == 0) {
    test_object_cold_102();
  }
  tnt_stream_free(s);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_object");
  fputc(10,_stdout);
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_object() {
	plan(102);
	header();

	struct tnt_stream *s = NULL; s = tnt_object(NULL);


	char str1[] = "I'm totaly duck, i can quack";
	ssize_t str1_len = strlen(str1);

	isnt(s, NULL, "Checking that object is allocated");
	is  (s->alloc, 1, "Checking s->alloc");
	is  (tnt_object_add_int(s, 1211),  3, "encoding int > 0");
	is  (tnt_object_add_int(s, -1211), 3, "encoding int < 0");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_str(s, str1, str1_len), str1_len + 1, "encoding str");
	is  (tnt_object_add_strz(s, str1), str1_len + 1, "encoding strz");

	is  (tnt_object_type(s, TNT_SBO_SPARSE), -1, "Check type set (must fail)");

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_SPARSE), 0, "Check type set (must be ok)");
	is  (tnt_object_add_array(s, 0), 5, "Sparse array");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_container_close(s), 0, "Closing container");
	is  (tnt_object_container_close(s), -1, "Erroneous container close");


	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_PACKED), 0, "Check type set (must be ok)");
	is  (tnt_object_add_array(s, 0), 1, "Packed array");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_container_close(s), 0, "Closing container");
	is  (tnt_object_container_close(s), -1, "Erroneous container close");


	/*
	 * {"menu": {
  	 *    "popup": {
    	 *      "menuitem": [
      	 *        {"value": "New", "onclick": "CreateNewDoc()"},
      	 *        {"value": "Open", "onclick": "OpenDoc()"},
      	 *        {"value": "Close", "onclick": "CloseDoc()"}
    	 *      ]
  	 *    }
	 *    "id": "file",
  	 *    "value": "File",
	 * }}
	 */

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_PACKED), 0, "Check type set (must be ok)");
	is  (tnt_object_add_map(s, 0), 1,			"Packing map-1");
	is  (tnt_object_add_strz(s, "menu"), 5,			"  Packing key (str)");
	is  (tnt_object_add_map(s, 0), 1,			"   Packing value (map-2)");
	is  (tnt_object_add_strz(s, "popup"), 6,		"  Packing key (str)");
	is  (tnt_object_add_map(s, 0), 1,			"   Packing value (map-3)");
	is  (tnt_object_add_strz(s, "menuitem"), 9,		"     Packing key (str)");
	is  (tnt_object_add_array(s, 0), 1,			"      Packing value (array)");
	is  (tnt_object_add_map(s, 0), 1,			"        Packing value (map-4)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "CreateNewDoc()"), 15,	"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "New"), 4,			"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-4");
	is  (tnt_object_add_map(s, 0), 1,			"        Packing value (map-5)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "OpenDoc()"), 10,		"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "Open"), 5,			"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-5");
	is  (tnt_object_add_map(s, 0), 1,			"        Packing value (map-6)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "CloseDoc()"), 11,		"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "Close"), 6,		"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-6");
	is  (tnt_object_container_close(s), 0,			"      Closing map-3");
	is  (tnt_object_container_close(s), 0,			"    Closing array");
	is  (tnt_object_add_strz(s, "id"), 3,			"  Packing key (str)");
	is  (tnt_object_add_strz(s, "file"), 5,			"   Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"  Packing key (str)");
	is  (tnt_object_add_strz(s, "File"), 5,			"   Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"  Closing map-2");
	is  (tnt_object_container_close(s), 0,			"Closing map-1");

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_SPARSE), 0, "Check type set (must be ok)");
	is  (tnt_object_add_map(s, 0), 5,			"Packing map-1");
	is  (tnt_object_add_strz(s, "menu"), 5,			"  Packing key (str)");
	is  (tnt_object_add_map(s, 0), 5,			"   Packing value (map-2)");
	is  (tnt_object_add_strz(s, "popup"), 6,		"  Packing key (str)");
	is  (tnt_object_add_map(s, 0), 5,			"   Packing value (map-3)");
	is  (tnt_object_add_strz(s, "menuitem"), 9,		"     Packing key (str)");
	is  (tnt_object_add_array(s, 0), 5,			"      Packing value (array)");
	is  (tnt_object_add_map(s, 0), 5,			"        Packing value (map-4)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "CreateNewDoc()"), 15,	"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "New"), 4,			"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-4");
	is  (tnt_object_add_map(s, 0), 5,			"        Packing value (map-5)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "OpenDoc()"), 10,		"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "Open"), 5,			"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-5");
	is  (tnt_object_add_map(s, 0), 5,			"        Packing value (map-6)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "CloseDoc()"), 11,		"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "Close"), 6,		"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-6");
	is  (tnt_object_container_close(s), 0,			"      Closing map-3");
	is  (tnt_object_container_close(s), 0,			"    Closing array");
	is  (tnt_object_add_strz(s, "id"), 3,			"  Packing key (str)");
	is  (tnt_object_add_strz(s, "file"), 5,			"   Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"  Packing key (str)");
	is  (tnt_object_add_strz(s, "File"), 5,			"   Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"  Closing map-2");
	is  (tnt_object_container_close(s), 0,			"Closing map-1");

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_PACKED), 0, "Check type set (must be ok)");
	is  (tnt_object_add_array(s, 0), 1, "Packing array (size more 1 byte)");
	for (int i = 0; i < 32; ++i) tnt_object_add_nil(s);
	is  (tnt_object_container_close(s), 0, "Closing array (size more 1 byte)");

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	isnt(tnt_object_format(s, "{%s{%s{%s[{%s%s%s%s}{%s%s%s%s}{%s%s%s%s}]}%s%s%s%s}}",
			       "menu", "popup", "menuitem",
			       "onclick", "CreateNewDoc()", "value", "New",
			       "onclick", "OpenDoc()", "value", "Open",
			       "onclick", "CloseDoc()", "value", "Close",
			       "id", "file", "value", "File"), -1, "Pack with format");

	tnt_stream_free(s);

	footer();
	return check_plan();
}